

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_disk_entry_from_file.c
# Opt level: O3

void test_read_disk_entry_from_file(void)

{
  wchar_t wVar1;
  int iVar2;
  archive *_a;
  char *pcVar3;
  FILE *__s;
  size_t v2;
  archive_entry *entry;
  la_int64_t v1;
  
  _a = archive_read_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_entry_from_file.c"
                   ,L'1',(uint)(_a != (archive *)0x0),"(a = archive_read_disk_new()) != NULL",
                   (void *)0x0);
  wVar1 = archive_read_disk_set_uname_lookup(_a,(void *)0x0,uname_lookup,(_func_void_void_ptr *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_entry_from_file.c"
                      ,L'4',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_read_disk_set_uname_lookup(a, NULL, &uname_lookup, NULL)",(void *)0x0
                     );
  wVar1 = archive_read_disk_set_gname_lookup(_a,(void *)0x0,gname_lookup,(_func_void_void_ptr *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_entry_from_file.c"
                      ,L'6',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_read_disk_set_gname_lookup(a, NULL, &gname_lookup, NULL)",(void *)0x0
                     );
  pcVar3 = archive_read_disk_uname(_a,0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_entry_from_file.c"
             ,L'7',pcVar3,"archive_read_disk_uname(a, 0)","FOO","\"FOO\"",(void *)0x0,L'\0');
  pcVar3 = archive_read_disk_gname(_a,0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_entry_from_file.c"
             ,L'8',pcVar3,"archive_read_disk_gname(a, 0)","FOOGROUP","\"FOOGROUP\"",(void *)0x0,
             L'\0');
  __s = fopen("foo","wb");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_entry_from_file.c"
                   ,L'<',(uint)(__s != (FILE *)0x0),"f != NULL",(void *)0x0);
  v2 = fwrite("1234",1,4,__s);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_entry_from_file.c"
                      ,L'=',4,"4",v2,"fwrite(\"1234\", 1, 4, f)",(void *)0x0);
  fclose(__s);
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_entry_from_file.c"
                   ,L'B',(uint)(entry != (archive_entry *)0x0),"entry != NULL",(void *)0x0);
  archive_entry_copy_pathname(entry,"foo");
  iVar2 = archive_read_disk_entry_from_file(_a,entry,-1,(stat_conflict *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_entry_from_file.c"
                      ,L'E',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_read_disk_entry_from_file(a, entry, -1, NULL)",_a);
  pcVar3 = archive_entry_uname(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_entry_from_file.c"
             ,L'H',pcVar3,"archive_entry_uname(entry)","FOO","\"FOO\"",(void *)0x0,L'\0');
  pcVar3 = archive_entry_gname(entry);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_entry_from_file.c"
             ,L'I',pcVar3,"archive_entry_gname(entry)","FOOGROUP","\"FOOGROUP\"",(void *)0x0,L'\0');
  v1 = archive_entry_size(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_entry_from_file.c"
                      ,L'J',v1,"archive_entry_size(entry)",4,"4",(void *)0x0);
  archive_entry_free(entry);
  iVar2 = archive_read_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_disk_entry_from_file.c"
                      ,L'N',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_disk_entry_from_file)
{
	struct archive *a;
	struct archive_entry *entry;
	FILE *f;

	assert((a = archive_read_disk_new()) != NULL);

	assertEqualInt(ARCHIVE_OK, archive_read_disk_set_uname_lookup(a,
			   NULL, &uname_lookup, NULL));
	assertEqualInt(ARCHIVE_OK, archive_read_disk_set_gname_lookup(a,
			   NULL, &gname_lookup, NULL));
	assertEqualString(archive_read_disk_uname(a, 0), "FOO");
	assertEqualString(archive_read_disk_gname(a, 0), "FOOGROUP");

	/* Create a file on disk. */
	f = fopen("foo", "wb");
	assert(f != NULL);
	assertEqualInt(4, fwrite("1234", 1, 4, f));
	fclose(f);

	/* Use archive_read_disk_entry_from_file to get information about it. */
	entry = archive_entry_new();
	assert(entry != NULL);
	archive_entry_copy_pathname(entry, "foo");
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_disk_entry_from_file(a, entry, -1, NULL));

	/* Verify the information we got back. */
	assertEqualString(archive_entry_uname(entry), "FOO");
	assertEqualString(archive_entry_gname(entry), "FOOGROUP");
	assertEqualInt(archive_entry_size(entry), 4);

	/* Destroy the archive. */
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}